

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int av1_search_intra_uv_modes_in_interframe
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int64_t best_rd)

{
  uint8_t uVar1;
  MB_MODE_INFO *pMVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TX_SIZE max_tx_size;
  UV_PREDICTION_MODE UVar8;
  int iVar9;
  long lVar10;
  AV1_COMP *xd;
  bool bVar11;
  
  pMVar2 = *(x->e_mbd).mi;
  if ((cpi->oxcf).tool_cfg.enable_palette == true) {
    xd = (AV1_COMP *)(ulong)pMVar2->bsize;
    iVar9 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,pMVar2->bsize)
    ;
    bVar11 = iVar9 != 0;
  }
  else {
    bVar11 = false;
    xd = cpi;
  }
  if (intra_search_state->rate_uv_intra == 0x7fffffff) {
    max_tx_size = av1_get_tx_size((int)x + 0x1a0,(MACROBLOCKD *)xd);
    av1_rd_pick_intra_sbuv_mode
              (cpi,x,&intra_search_state->rate_uv_intra,&intra_search_state->rate_uv_tokenonly,
               &intra_search_state->dist_uvs,&intra_search_state->skip_uvs,bsize,max_tx_size);
    UVar8 = pMVar2->uv_mode;
    intra_search_state->mode_uv = UVar8;
    if (bVar11) {
      *(undefined2 *)(intra_search_state->pmi_uv).palette_size =
           *(undefined2 *)(pMVar2->palette_mode_info).palette_size;
      uVar3 = *(undefined8 *)(pMVar2->palette_mode_info).palette_colors;
      uVar4 = *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 4);
      uVar5 = *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 8);
      uVar6 = *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0xc);
      uVar7 = *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0x14);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10) =
           *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0x10);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14) = uVar7;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8) = uVar5;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc) = uVar6;
      *(undefined8 *)(intra_search_state->pmi_uv).palette_colors = uVar3;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 4) = uVar4;
    }
    intra_search_state->uv_angle_delta = pMVar2->angle_delta[1];
    iVar9 = intra_search_state->rate_uv_tokenonly;
    lVar10 = intra_search_state->dist_uvs;
    if (best_rd < lVar10 * 0x80 + ((long)x->rdmult * (long)iVar9 + 0x100 >> 9)) {
      intra_search_state->skip_intra_modes = 1;
      return 0;
    }
  }
  else {
    iVar9 = intra_search_state->rate_uv_tokenonly;
    lVar10 = intra_search_state->dist_uvs;
    UVar8 = intra_search_state->mode_uv;
  }
  rd_stats_uv->rate = iVar9;
  rd_stats_uv->dist = lVar10;
  uVar1 = intra_search_state->skip_uvs;
  rd_stats_uv->skip_txfm = uVar1;
  rd_stats->skip_txfm = uVar1 != '\0' && rd_stats_y->skip_txfm != '\0';
  pMVar2->uv_mode = UVar8;
  if (bVar11) {
    (pMVar2->palette_mode_info).palette_size[1] = (intra_search_state->pmi_uv).palette_size[1];
    uVar3 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc);
    uVar4 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10);
    uVar5 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14);
    *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 8) =
         *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8);
    *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0xc) = uVar3;
    *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0x10) = uVar4;
    *(undefined8 *)((pMVar2->palette_mode_info).palette_colors + 0x14) = uVar5;
  }
  pMVar2->angle_delta[1] = intra_search_state->uv_angle_delta;
  return 1;
}

Assistant:

int av1_search_intra_uv_modes_in_interframe(
    IntraModeSearchState *intra_search_state, const AV1_COMP *cpi,
    MACROBLOCK *x, BLOCK_SIZE bsize, RD_STATS *rd_stats,
    const RD_STATS *rd_stats_y, RD_STATS *rd_stats_uv, int64_t best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);

  // TODO(chiyotsai@google.com): Consolidate the chroma search code here with
  // the one in av1_search_palette_mode.
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cm->features.allow_screen_content_tools, mbmi->bsize);

  assert(intra_search_state->rate_uv_intra == INT_MAX);
  if (intra_search_state->rate_uv_intra == INT_MAX) {
    // If no good uv-predictor had been found, search for it.
    const TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
    av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                &intra_search_state->rate_uv_tokenonly,
                                &intra_search_state->dist_uvs,
                                &intra_search_state->skip_uvs, bsize, uv_tx);
    intra_search_state->mode_uv = mbmi->uv_mode;
    if (try_palette) intra_search_state->pmi_uv = *pmi;
    intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];

    const int uv_rate = intra_search_state->rate_uv_tokenonly;
    const int64_t uv_dist = intra_search_state->dist_uvs;
    const int64_t uv_rd = RDCOST(x->rdmult, uv_rate, uv_dist);
    if (uv_rd > best_rd) {
      // If there is no good intra uv-mode available, we can skip all intra
      // modes.
      intra_search_state->skip_intra_modes = 1;
      return 0;
    }
  }

  // If we are here, then the encoder has found at least one good intra uv
  // predictor, so we can directly copy its statistics over.
  // TODO(any): the stats here is not right if the best uv mode is CFL but the
  // best y mode is palette.
  rd_stats_uv->rate = intra_search_state->rate_uv_tokenonly;
  rd_stats_uv->dist = intra_search_state->dist_uvs;
  rd_stats_uv->skip_txfm = intra_search_state->skip_uvs;
  rd_stats->skip_txfm = rd_stats_y->skip_txfm && rd_stats_uv->skip_txfm;
  mbmi->uv_mode = intra_search_state->mode_uv;
  if (try_palette) {
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
           intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
           2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
  }
  mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;

  return 1;
}